

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

void format_dice_string(random_value *v,int multiplier,size_t len,char *dice_string)

{
  char *dice_string_local;
  size_t len_local;
  int multiplier_local;
  random_value *v_local;
  
  if ((v->dice == 0) || (v->base == 0)) {
    if (v->dice == 0) {
      strnfmt(dice_string,len,"%d",(ulong)(uint)(multiplier * v->base));
    }
    else if (multiplier == 1) {
      strnfmt(dice_string,len,"%dd%d",(ulong)(uint)v->dice,(ulong)(uint)v->sides);
    }
    else {
      strnfmt(dice_string,len,"%d*(%dd%d)",(ulong)(uint)multiplier,(ulong)(uint)v->dice,
              (ulong)(uint)v->sides);
    }
  }
  else if (multiplier == 1) {
    strnfmt(dice_string,len,"%d+%dd%d",(ulong)(uint)v->base,(ulong)(uint)v->dice,
            (ulong)(uint)v->sides);
  }
  else {
    strnfmt(dice_string,len,"%d+%d*(%dd%d)",(ulong)(uint)(multiplier * v->base),
            (ulong)(uint)multiplier,(ulong)(uint)v->dice,v->sides);
  }
  return;
}

Assistant:

static void format_dice_string(const random_value *v, int multiplier,
	size_t len, char* dice_string)
{
	if (v->dice && v->base) {
		if (multiplier == 1) {
			strnfmt(dice_string, len, "%d+%dd%d", v->base, v->dice,
				v->sides);
		} else {
			strnfmt(dice_string, len, "%d+%d*(%dd%d)",
				multiplier * v->base, multiplier, v->dice,
				v->sides);
		}
	} else if (v->dice) {
		if (multiplier == 1) {
			strnfmt(dice_string, len, "%dd%d", v->dice, v->sides);
		} else {
			strnfmt(dice_string, len, "%d*(%dd%d)", multiplier,
				v->dice, v->sides);
		}
	} else {
		strnfmt(dice_string, len, "%d", multiplier * v->base);
	}
}